

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

void __thiscall RSA::print_last_plaintext_line(RSA *this)

{
  string *psVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  ostream *poVar4;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Plain Text",&local_39);
  Crypto::print_header(&this->super_Crypto,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  psVar1 = &(this->super_Crypto).plainText;
  _Var3._M_current = (this->super_Crypto).plainText._M_dataplus._M_p;
  local_38._M_dataplus._M_p._0_1_ = 0x5f;
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var3,_Var3._M_current + (this->super_Crypto).plainText._M_string_length,
                     (_Iter_equals_val<const_char>)&local_38);
  std::__cxx11::string::erase
            (psVar1,_Var3._M_current,
             (this->super_Crypto).plainText._M_dataplus._M_p +
             (this->super_Crypto).plainText._M_string_length);
  poVar4 = std::operator<<((ostream *)&std::cout,"Text: ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  bVar2 = BigInt::isZero(&this->plain_BigInt);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Num: ");
    poVar4 = operator<<(poVar4,&this->plain_BigInt);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return;
}

Assistant:

void RSA::print_last_plaintext_line() {
    print_header("Plain Text");
    plainText.erase(std::remove(plainText.begin(), plainText.end(), '_'), plainText.end()); //! remove any special character
    cout << "Text: " << plainText << endl;

    if (!plain_BigInt.isZero())
        cout << "Num: " << plain_BigInt << endl;
}